

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSTLImportExport.cpp
# Opt level: O1

void __thiscall
utSTLImporterExporter_test_with_empty_solid_Test::TestBody
          (utSTLImporterExporter_test_with_empty_solid_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Importer importer;
  aiScene *scene;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  Importer local_18;
  aiScene *local_10;
  
  Assimp::Importer::Importer(&local_18);
  local_10 = Assimp::Importer::ReadFile
                       (&local_18,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/STL/triangle_with_empty_solid.stl"
                        ,0);
  local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            (local_28,"nullptr","scene",&local_38.ptr_,&local_10);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSTLImportExport.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Assimp::Importer::ReadFile
                 (&local_18,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/STL/triangle_with_empty_solid.stl"
                  ,0x400);
  local_30.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<aiScene_const*,aiScene_const*>
            (local_28,"nullptr","scene2",(aiScene **)&local_30,(aiScene **)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSTLImportExport.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((aiScene *)local_38.ptr_ != (aiScene *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((aiScene *)local_38.ptr_ != (aiScene *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::Importer::~Importer(&local_18);
  return;
}

Assistant:

TEST_F(utSTLImporterExporter, test_with_empty_solid) {
    Assimp::Importer importer;
    //STL File with empty mesh. We should still be able to import other meshes in this file. ValidateDataStructure should fail.
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/STL/triangle_with_empty_solid.stl", 0);
    EXPECT_NE(nullptr, scene);

    const aiScene *scene2 = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/STL/triangle_with_empty_solid.stl", aiProcess_ValidateDataStructure);
    EXPECT_EQ(nullptr, scene2);
}